

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void __thiscall CClient::Run(CClient *this)

{
  int *piVar1;
  float (*pafVar2) [3];
  IKernel *pIVar3;
  long lVar4;
  NETADDR BindAddr;
  NETADDR BindAddr_00;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int64 iVar9;
  IEngineGraphics *pIVar10;
  undefined8 uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int64 iVar12;
  char *fmt;
  long in_FS_OFFSET;
  float fVar13;
  char aBuf [256];
  NETADDR local_138 [10];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar9 = time_get();
  this->m_LocalStartTime = iVar9;
  this->m_SnapshotParts = 0;
  iVar6 = SDL_Init(0);
  if (iVar6 < 0) {
    uVar11 = SDL_GetError();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      dbg_msg("client","unable to init SDL base: %s",uVar11);
      return;
    }
    goto LAB_001238f5;
  }
  atexit(SDL_Quit);
  pIVar10 = CreateEngineGraphicsThreaded();
  this->m_pGraphics = pIVar10;
  pIVar3 = (this->super_IClient).super_IInterface.m_pKernel;
  iVar6 = (**pIVar3->_vptr_IKernel)(pIVar3,"enginegraphics",pIVar10);
  if ((((char)iVar6 == '\0') ||
      (pIVar3 = (this->super_IClient).super_IInterface.m_pKernel,
      iVar6 = (**pIVar3->_vptr_IKernel)(pIVar3,"graphics",this->m_pGraphics), (char)iVar6 == '\0'))
     || (iVar6 = (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x2b])(),
        iVar6 != 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      dbg_msg("client","couldn\'t init graphics");
      return;
    }
    goto LAB_001238f5;
  }
  iVar6 = (*(this->m_pSound->super_ISound).super_IInterface._vptr_IInterface[0xc])();
  this->m_SoundInitFailed = iVar6 != 0;
  (*(this->m_pSound->super_ISound).super_IInterface._vptr_IInterface[6])
            ((float)(this->m_pGraphics->super_IGraphics).m_ScreenWidth * 1.5 * 0.5);
  if ((this->m_pConfig->m_Bindaddr[0] == '\0') ||
     (iVar6 = net_host_lookup(this->m_pConfig->m_Bindaddr,local_138,3), iVar6 != 0)) {
    mem_zero(local_138,0x18);
  }
  local_138[0].type = 3;
  BindAddr.port = local_138[0].port;
  BindAddr.ip[0xc] = local_138[0].ip[0xc];
  BindAddr.ip[0xd] = local_138[0].ip[0xd];
  BindAddr.ip[0xe] = local_138[0].ip[0xe];
  BindAddr.ip[0xf] = local_138[0].ip[0xf];
  BindAddr.reserved = local_138[0].reserved;
  BindAddr.ip[0] = local_138[0].ip[0];
  BindAddr.ip[1] = local_138[0].ip[1];
  BindAddr.ip[2] = local_138[0].ip[2];
  BindAddr.ip[3] = local_138[0].ip[3];
  BindAddr.type = 3;
  BindAddr.ip[4] = local_138[0].ip[4];
  BindAddr.ip[5] = local_138[0].ip[5];
  BindAddr.ip[6] = local_138[0].ip[6];
  BindAddr.ip[7] = local_138[0].ip[7];
  BindAddr.ip[8] = local_138[0].ip[8];
  BindAddr.ip[9] = local_138[0].ip[9];
  BindAddr.ip[10] = local_138[0].ip[10];
  BindAddr.ip[0xb] = local_138[0].ip[0xb];
  bVar5 = CNetClient::Open(&this->m_NetClient,BindAddr,this->m_pConfig,this->m_pConsole,
                           this->m_pEngine,(uint)(local_138[0].port == 0));
  if (bVar5) {
    local_138[0].port = 0;
    BindAddr_00.port = 0;
    BindAddr_00.ip[0xc] = local_138[0].ip[0xc];
    BindAddr_00.ip[0xd] = local_138[0].ip[0xd];
    BindAddr_00.ip[0xe] = local_138[0].ip[0xe];
    BindAddr_00.ip[0xf] = local_138[0].ip[0xf];
    BindAddr_00.reserved = local_138[0].reserved;
    BindAddr_00.ip[0] = local_138[0].ip[0];
    BindAddr_00.ip[1] = local_138[0].ip[1];
    BindAddr_00.ip[2] = local_138[0].ip[2];
    BindAddr_00.ip[3] = local_138[0].ip[3];
    BindAddr_00.type = local_138[0].type;
    BindAddr_00.ip[4] = local_138[0].ip[4];
    BindAddr_00.ip[5] = local_138[0].ip[5];
    BindAddr_00.ip[6] = local_138[0].ip[6];
    BindAddr_00.ip[7] = local_138[0].ip[7];
    BindAddr_00.ip[8] = local_138[0].ip[8];
    BindAddr_00.ip[9] = local_138[0].ip[9];
    BindAddr_00.ip[10] = local_138[0].ip[10];
    BindAddr_00.ip[0xb] = local_138[0].ip[0xb];
    bVar5 = CNetClient::Open(&this->m_ContactClient,BindAddr_00,this->m_pConfig,this->m_pConsole,
                             this->m_pEngine,0);
    if (!bVar5) {
      fmt = "couldn\'t open socket(contact)";
      goto LAB_0012386c;
    }
    (*(this->m_pTextRender->super_ITextRender).super_IInterface._vptr_IInterface[0x14])();
    (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[0x1a])();
    (*(this->m_pMasterServer->super_IMasterServer).super_IInterface._vptr_IInterface[6])
              (this->m_pMasterServer,
               (ulong)(uint)(this->m_ContactClient).super_CNetBase.m_Socket.type);
    (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[4])();
    iVar6 = (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[0x13])();
    str_format((char *)local_138,0x100,"netversion %s",CONCAT44(extraout_var,iVar6));
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"client",local_138,0);
    iVar6 = (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[0x14])();
    iVar7 = (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[0x15])();
    iVar6 = str_comp((char *)CONCAT44(extraout_var_00,iVar6),(char *)CONCAT44(extraout_var_01,iVar7)
                    );
    if (iVar6 != 0) {
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"client","WARNING: netversion hash differs",0);
    }
    iVar6 = (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[0x12])();
    str_format((char *)local_138,0x100,"game version %s",CONCAT44(extraout_var_02,iVar6));
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"client",local_138,0);
    (this->m_FpsGraph).m_Min = 0.0;
    (this->m_FpsGraph).m_Max = 120.0;
    (this->m_FpsGraph).m_MinRange = 0.0;
    (this->m_FpsGraph).m_MaxRange = 120.0;
    (this->m_FpsGraph).m_Index = 0;
    this->m_pConfig->m_ClEditor = 0;
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x10])(this->m_pConsole,0);
LAB_0012341d:
    VersionUpdate(this);
    if (this->m_aCmdConnect[0] != '\0') {
      (*(this->super_IClient).super_IInterface._vptr_IInterface[2])(this,this->m_aCmdConnect);
      this->m_aCmdConnect[0] = '\0';
    }
    iVar6 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[0x1b])();
    if (iVar6 != 0) goto LAB_00123885;
    (*(this->m_pSound->super_ISound).super_IInterface._vptr_IInterface[0xd])();
    iVar6 = (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x34])();
    if (iVar6 == 0) {
      if (this->m_WindowMustRefocus == 0) goto LAB_001234a2;
LAB_001234ac:
      this->m_WindowMustRefocus = 1;
    }
    else if ((this->m_pConfig->m_DbgFocus != 0) &&
            (iVar6 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[5])
                               (this->m_pInput,0x1b,1), (char)iVar6 != '\0')) {
LAB_001234a2:
      (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[10])();
      goto LAB_001234ac;
    }
    if ((this->m_WindowMustRefocus != 0) &&
       (iVar6 = (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x34])(),
       iVar6 != 0)) {
      if (this->m_WindowMustRefocus < 3) {
        (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[10])();
        this->m_WindowMustRefocus = this->m_WindowMustRefocus + 1;
      }
      if ((2 < this->m_WindowMustRefocus) ||
         (iVar6 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[5])
                            (this->m_pInput,0x19b,1), (char)iVar6 != '\0')) {
        (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[9])();
        this->m_WindowMustRefocus = 0;
        iVar6 = (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x31])();
        if ((-1 < iVar6) && (iVar6 != this->m_pConfig->m_GfxScreen)) {
          this->m_pConfig->m_GfxScreen = iVar6;
        }
      }
    }
    iVar6 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[4])
                      (this->m_pInput,0x160);
    iVar7 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[4])
                      (this->m_pInput,0x161);
    if ((byte)((byte)iVar7 & (byte)iVar6) != 1) {
LAB_00123621:
      if (this->m_pConfig->m_ClEditor == 0) {
        if (this->m_EditorActive == true) {
          this->m_EditorActive = false;
        }
      }
      else if (this->m_EditorActive == false) {
        (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[0xf])();
        (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[9])();
        this->m_EditorActive = true;
      }
      (*(this->m_pTextRender->super_ITextRender).super_IInterface._vptr_IInterface[0x15])();
      Update(this);
      bVar5 = LimitFps(this);
      if ((!bVar5) &&
         ((this->m_pConfig->m_GfxAsyncRender == 0 ||
          (iVar6 = (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x29])()
          , (char)iVar6 != '\0')))) {
        this->m_RenderFrames = this->m_RenderFrames + 1;
        iVar9 = time_get();
        lVar4 = this->m_LastRenderTime;
        iVar12 = time_freq();
        fVar13 = (float)(iVar9 - lVar4) / (float)iVar12;
        (this->super_IClient).m_RenderFrameTime = fVar13;
        if (fVar13 < this->m_RenderFrameTimeLow) {
          this->m_RenderFrameTimeLow = fVar13;
        }
        if (this->m_RenderFrameTimeHigh <= fVar13 && fVar13 != this->m_RenderFrameTimeHigh) {
          this->m_RenderFrameTimeHigh = fVar13;
        }
        iVar6 = (this->m_FpsGraph).m_Index;
        uVar8 = iVar6 + 0x80;
        if (-1 < (int)(iVar6 + 1U)) {
          uVar8 = iVar6 + 1U;
        }
        iVar6 = (iVar6 - (uVar8 & 0xffffff80)) + 1;
        (this->m_FpsGraph).m_Index = iVar6;
        (this->m_FpsGraph).m_aValues[iVar6] = 1.0 / fVar13;
        pafVar2 = (this->m_FpsGraph).m_aColors + iVar6;
        *(float *)((long)pafVar2 + 0) = 1.0;
        *(float *)((long)pafVar2 + 4) = 1.0;
        (this->m_FpsGraph).m_aColors[iVar6][2] = 1.0;
        this->m_LastRenderTime = iVar9;
        if ((this->m_pConfig->m_DbgStress == 0) ||
           (uVar8 = this->m_RenderFrames * -0x33333333 + 0x19999998,
           (uVar8 >> 1 | (uint)((uVar8 & 1) != 0) << 0x1f) < 0x19999999)) {
          Render(this);
          (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x26])();
        }
      }
      AutoScreenshot_Cleanup(this);
      if ((this->super_IClient).m_State == 5) goto LAB_00123885;
      iVar6 = this->m_pConfig->m_ClCpuThrottle;
      if (((iVar6 != 0) || (iVar6 = 5, this->m_pConfig->m_DbgStress != 0)) ||
         (iVar7 = (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x34])(),
         iVar7 == 0)) {
        thread_sleep(iVar6);
      }
      iVar6 = this->m_pConfig->m_DbgHitch;
      if (iVar6 != 0) {
        thread_sleep(iVar6);
        this->m_pConfig->m_DbgHitch = 0;
      }
      iVar9 = time_get();
      lVar4 = this->m_LocalStartTime;
      iVar12 = time_freq();
      (this->super_IClient).m_LocalTime = (float)(iVar9 - lVar4) / (float)iVar12;
      goto LAB_0012341d;
    }
    iVar6 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[5])
                      (this->m_pInput,0x71,1);
    if ((char)iVar6 == '\0') {
      iVar6 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[5])
                        (this->m_pInput,100,1);
      if ((char)iVar6 != '\0') {
        piVar1 = &this->m_pConfig->m_Debug;
        *piVar1 = *piVar1 ^ 1;
      }
      iVar6 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[5])
                        (this->m_pInput,0x67,1);
      if ((char)iVar6 != '\0') {
        piVar1 = &this->m_pConfig->m_DbgGraphs;
        *piVar1 = *piVar1 ^ 1;
      }
      iVar6 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[5])
                        (this->m_pInput,0x65,1);
      if ((char)iVar6 != '\0') {
        piVar1 = &this->m_pConfig->m_ClEditor;
        *piVar1 = *piVar1 ^ 1;
        (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[9])();
      }
      goto LAB_00123621;
    }
    (*(this->super_IClient).super_IInterface._vptr_IInterface[4])(this);
LAB_00123885:
    (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[8])();
    (*(this->super_IClient).super_IInterface._vptr_IInterface[3])(this);
    (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x2c])();
    (*(this->m_pSound->super_ISound).super_IInterface._vptr_IInterface[0xe])();
    (*(this->m_pTextRender->super_ITextRender).super_IInterface._vptr_IInterface[0x16])();
    CServerBrowser::SaveServerlist(&this->m_ServerBrowser);
    SDL_Quit();
  }
  else {
    fmt = "couldn\'t open socket(net)";
LAB_0012386c:
    dbg_msg("client",fmt);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001238f5:
  __stack_chk_fail();
}

Assistant:

void CClient::Run()
{
	m_LocalStartTime = time_get();
	m_SnapshotParts = 0;

	// init SDL
	{
		if(SDL_Init(0) < 0)
		{
			dbg_msg("client", "unable to init SDL base: %s", SDL_GetError());
			return;
		}

		atexit(SDL_Quit); // ignore_convention
	}

	// init graphics
	{
		m_pGraphics = CreateEngineGraphicsThreaded();

		bool RegisterFail = false;
		RegisterFail = RegisterFail || !Kernel()->RegisterInterface(static_cast<IEngineGraphics*>(m_pGraphics)); // register graphics as both
		RegisterFail = RegisterFail || !Kernel()->RegisterInterface(static_cast<IGraphics*>(m_pGraphics));

		if(RegisterFail || m_pGraphics->Init() != 0)
		{
			dbg_msg("client", "couldn't init graphics");
			return;
		}
	}

	// init sound, allowed to fail
	m_SoundInitFailed = Sound()->Init() != 0;
	Sound()->SetMaxDistance(1.5f*Graphics()->ScreenWidth()/2.0f);

	// open socket
	{
		NETADDR BindAddr;
		if(Config()->m_Bindaddr[0] && net_host_lookup(Config()->m_Bindaddr, &BindAddr, NETTYPE_ALL) == 0)
		{
			// got bindaddr
			BindAddr.type = NETTYPE_ALL;
		}
		else
		{
			mem_zero(&BindAddr, sizeof(BindAddr));
			BindAddr.type = NETTYPE_ALL;
		}
		if(!m_NetClient.Open(BindAddr, Config(), Console(), Engine(), BindAddr.port ? 0 : NETCREATE_FLAG_RANDOMPORT))
		{
			dbg_msg("client", "couldn't open socket(net)");
			return;
		}
		BindAddr.port = 0;
		if(!m_ContactClient.Open(BindAddr, Config(), Console(), Engine(), 0))
		{
			dbg_msg("client", "couldn't open socket(contact)");
			return;
		}
	}

	// init font rendering
	m_pTextRender->Init();

	// init the input
	Input()->Init();

	// start refreshing addresses while we load
	MasterServer()->RefreshAddresses(m_ContactClient.NetType());

	GameClient()->OnInit();

	char aBuf[256];
	str_format(aBuf, sizeof(aBuf), "netversion %s", GameClient()->NetVersion());
	m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client", aBuf);
	if(str_comp(GameClient()->NetVersionHashUsed(), GameClient()->NetVersionHashReal()))
	{
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client", "WARNING: netversion hash differs");
	}
	str_format(aBuf, sizeof(aBuf), "game version %s", GameClient()->Version());
	m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client", aBuf);

	//
	m_FpsGraph.Init(0.0f, 120.0f);

	// never start with the editor
	Config()->m_ClEditor = 0;

	// process pending commands
	m_pConsole->StoreCommands(false);

	while (1)
	{
		//
		VersionUpdate();

		// handle pending connects
		if(m_aCmdConnect[0])
		{
			Connect(m_aCmdConnect);
			m_aCmdConnect[0] = 0;
		}

		// update input
		if(Input()->Update())
			break;	// SDL_QUIT

		// update sound
		Sound()->Update();

		// release focus
		if(!m_pGraphics->WindowActive())
		{
			if(m_WindowMustRefocus == 0)
				Input()->MouseModeAbsolute();
			m_WindowMustRefocus = 1;
		}
		else if (Config()->m_DbgFocus && Input()->KeyPress(KEY_ESCAPE, true))
		{
			Input()->MouseModeAbsolute();
			m_WindowMustRefocus = 1;
		}

		// refocus
		if(m_WindowMustRefocus && m_pGraphics->WindowActive())
		{
			if(m_WindowMustRefocus < 3)
			{
				Input()->MouseModeAbsolute();
				m_WindowMustRefocus++;
			}

			if(m_WindowMustRefocus >= 3 || Input()->KeyPress(KEY_MOUSE_1, true))
			{
				Input()->MouseModeRelative();
				m_WindowMustRefocus = 0;

				// update screen in case it got moved
				int ActScreen = Graphics()->GetWindowScreen();
				if(ActScreen >= 0 && ActScreen != Config()->m_GfxScreen)
					Config()->m_GfxScreen = ActScreen;
			}
		}

		// panic quit button
		bool IsCtrlPressed = Input()->KeyIsPressed(KEY_LCTRL);
		bool IsLShiftPressed = Input()->KeyIsPressed(KEY_LSHIFT);
		if(IsCtrlPressed && IsLShiftPressed && Input()->KeyPress(KEY_Q, true))
		{
			Quit();
			break;
		}

		if(IsCtrlPressed && IsLShiftPressed && Input()->KeyPress(KEY_D, true))
			Config()->m_Debug ^= 1;

		if(IsCtrlPressed && IsLShiftPressed && Input()->KeyPress(KEY_G, true))
			Config()->m_DbgGraphs ^= 1;

		if(IsCtrlPressed && IsLShiftPressed && Input()->KeyPress(KEY_E, true))
		{
			Config()->m_ClEditor = Config()->m_ClEditor^1;
			Input()->MouseModeRelative();
		}

		// render
		{
			if(Config()->m_ClEditor)
			{
				if(!m_EditorActive)
				{
					GameClient()->OnActivateEditor();
					Input()->MouseModeRelative();
					m_EditorActive = true;
				}
			}
			else if(m_EditorActive)
				m_EditorActive = false;
			
			m_pTextRender->Update();

			Update();

			const bool SkipFrame = LimitFps();

			if(!SkipFrame && (!Config()->m_GfxAsyncRender || m_pGraphics->IsIdle()))
			{
				m_RenderFrames++;

				// update frametime
				int64 Now = time_get();
				m_RenderFrameTime = (Now - m_LastRenderTime) / (float)time_freq();

				if(m_RenderFrameTime < m_RenderFrameTimeLow)
					m_RenderFrameTimeLow = m_RenderFrameTime;
				if(m_RenderFrameTime > m_RenderFrameTimeHigh)
					m_RenderFrameTimeHigh = m_RenderFrameTime;
				m_FpsGraph.Add(1.0f/m_RenderFrameTime, 1,1,1);

				m_LastRenderTime = Now;

				// when we are stress testing only render every 10th frame
				if(!Config()->m_DbgStress || (m_RenderFrames%10) == 0 )
				{
					Render();
					m_pGraphics->Swap();
				}
			}
		}

		AutoScreenshot_Cleanup();

		// check conditions
		if(State() == IClient::STATE_QUITING)
			break;

		// beNice
		if(Config()->m_ClCpuThrottle)
			thread_sleep(Config()->m_ClCpuThrottle);
		else if(Config()->m_DbgStress || !m_pGraphics->WindowActive())
			thread_sleep(5);

		if(Config()->m_DbgHitch)
		{
			thread_sleep(Config()->m_DbgHitch);
			Config()->m_DbgHitch = 0;
		}

		/*
		if(ReportTime < time_get())
		{
			if(0 && Config()->m_Debug)
			{
				dbg_msg("client/report", "fps=%.02f (%.02f %.02f) netstate=%d",
					m_Frames/(float)(ReportInterval/time_freq()),
					1.0f/m_RenderFrameTimeHigh,
					1.0f/m_RenderFrameTimeLow,
					m_NetClient.State());
			}
			m_RenderFrameTimeLow = 1;
			m_RenderFrameTimeHigh = 0;
			m_RenderFrames = 0;
			ReportTime += ReportInterval;
		}*/

		// update local time
		m_LocalTime = (time_get()-m_LocalStartTime)/(float)time_freq();
	}

	GameClient()->OnShutdown();
	Disconnect();

	m_pGraphics->Shutdown();
	m_pSound->Shutdown();
	m_pTextRender->Shutdown();

	m_ServerBrowser.SaveServerlist();

	// shutdown SDL
	SDL_Quit();
}